

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.cc
# Opt level: O2

void Imageio::declareImageioFormat
               (string *formatname,Creator inputCreator,char **inputExtensions,Creator outputCreator
               ,char **outputExtensions)

{
  iterator iVar1;
  mapped_type *pp_Var2;
  iterator iVar3;
  mapped_type *pp_Var4;
  char **e;
  char **e_1;
  string ext;
  allocator<char> local_a9;
  key_type *local_a8;
  mapped_type local_a0;
  mapped_type local_98;
  key_type local_90;
  string local_70 [32];
  string local_50 [32];
  
  local_a8 = formatname;
  local_a0 = outputCreator;
  local_98 = inputCreator;
  if (inputCreator != (Creator)0x0) {
    for (; (inputExtensions != (char **)0x0 && (*inputExtensions != (char *)0x0));
        inputExtensions = inputExtensions + 1) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,*inputExtensions,&local_a9);
      string::tolower((string *)local_50,(int)&local_90);
      ::std::__cxx11::string::~string(local_50);
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                      *)inputFormats_abi_cxx11_,&local_90);
      if (iVar1._M_node == (_Base_ptr)(inputFormats_abi_cxx11_ + 8)) {
        pp_Var2 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                                *)inputFormats_abi_cxx11_,&local_90);
        *pp_Var2 = local_98;
      }
      ::std::__cxx11::string::~string((string *)&local_90);
    }
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                    *)inputFormats_abi_cxx11_,local_a8);
    if (iVar1._M_node == (_Base_ptr)(inputFormats_abi_cxx11_ + 8)) {
      pp_Var2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                              *)inputFormats_abi_cxx11_,local_a8);
      *pp_Var2 = local_98;
    }
  }
  if (local_a0 != (mapped_type)0x0) {
    for (; (outputExtensions != (char **)0x0 && (*outputExtensions != (char *)0x0));
        outputExtensions = outputExtensions + 1) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,*outputExtensions,&local_a9);
      string::tolower((string *)local_70,(int)&local_90);
      ::std::__cxx11::string::~string(local_70);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                      *)outputFormats_abi_cxx11_,&local_90);
      if (iVar3._M_node == (_Base_ptr)(outputFormats_abi_cxx11_ + 8)) {
        pp_Var4 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                                *)outputFormats_abi_cxx11_,&local_90);
        *pp_Var4 = local_a0;
      }
      ::std::__cxx11::string::~string((string *)&local_90);
    }
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                    *)outputFormats_abi_cxx11_,local_a8);
    if (iVar3._M_node == (_Base_ptr)(outputFormats_abi_cxx11_ + 8)) {
      pp_Var4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                              *)outputFormats_abi_cxx11_,local_a8);
      *pp_Var4 = local_a0;
    }
  }
  return;
}

Assistant:

void
declareImageioFormat(const std::string& formatname,
                     ImageInput::Creator inputCreator,
                     const char** inputExtensions,
                     ImageOutput::Creator outputCreator,
                     const char** outputExtensions)
{
    if (inputCreator) {
        for (const char** e = inputExtensions; e && *e; ++e) {
            string ext(*e);
            ext.tolower();
            if (inputFormats.find(ext) == inputFormats.end()) {
                inputFormats[ext] = inputCreator;
            }
        }
        if (inputFormats.find(formatname) == inputFormats.end())
            inputFormats[formatname] = inputCreator;
    }
    if (outputCreator) {
        for (const char** e = outputExtensions; e && *e; ++e) {
            string ext(*e);
            ext.tolower();
            if (outputFormats.find(ext) == outputFormats.end()) {
                outputFormats[ext] = outputCreator;
            }
        }
        if (outputFormats.find(formatname) == outputFormats.end())
            outputFormats[formatname] = outputCreator;
    }
}